

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ExpandLinkItems
          (cmGeneratorTarget *this,string *prop,string *value,string *config,
          cmGeneratorTarget *headTarget,bool usage_requirements_only,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *items,bool *hadHeadSensitiveCondition)

{
  cmLocalGenerator *lg;
  Snapshot snapshot;
  bool bVar1;
  string *target;
  cmCompiledGeneratorExpression *pcVar2;
  char *pcVar3;
  allocator local_241;
  string local_240;
  string local_220;
  undefined1 local_200 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libs;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmCommandContext local_f8;
  Snapshot local_d0;
  cmListFileBacktrace local_b8;
  undefined1 local_78 [8];
  cmGeneratorExpression ge;
  bool usage_requirements_only_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  string *value_local;
  string *prop_local;
  cmGeneratorTarget *this_local;
  
  ge.Backtrace.Snapshot.Position.Position._7_1_ = usage_requirements_only;
  cmState::Snapshot::Snapshot(&local_d0,(cmState *)0x0);
  cmCommandContext::cmCommandContext(&local_f8);
  snapshot.Position.Tree = local_d0.Position.Tree;
  snapshot.State = local_d0.State;
  snapshot.Position.Position = local_d0.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&local_b8,snapshot,&local_f8);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_78,&local_b8);
  cmListFileBacktrace::~cmListFileBacktrace(&local_b8);
  cmCommandContext::~cmCommandContext(&local_f8);
  target = GetName_abi_cxx11_(this);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)
             &libs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,target,prop,
             (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
  if ((ge.Backtrace.Snapshot.Position.Position._7_1_ & 1) != 0) {
    cmGeneratorExpressionDAGChecker::SetTransitivePropertiesOnly
              ((cmGeneratorExpressionDAGChecker *)
               &libs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&cge);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_200,(string *)local_78);
  local_200._8_8_ = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_200);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_200 + 0x10),
             (auto_ptr_ref<cmCompiledGeneratorExpression>)local_200._8_8_);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_200);
  pcVar2 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                     ((auto_ptr<cmCompiledGeneratorExpression> *)(local_200 + 0x10));
  lg = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_240);
  pcVar3 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar2,lg,config,false,headTarget,this,
                      (cmGeneratorExpressionDAGChecker *)
                      &libs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,pcVar3,&local_241);
  cmSystemTools::ExpandListArgument
            (&local_220,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cge,false);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string((string *)&local_240);
  LookupLinkItems(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&cge,items);
  pcVar2 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                     ((auto_ptr<cmCompiledGeneratorExpression> *)(local_200 + 0x10));
  bVar1 = cmCompiledGeneratorExpression::GetHadHeadSensitiveCondition(pcVar2);
  *hadHeadSensitiveCondition = bVar1;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_200 + 0x10));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&cge);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)
             &libs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_78);
  return;
}

Assistant:

void cmGeneratorTarget::ExpandLinkItems(std::string const& prop,
                               std::string const& value,
                               std::string const& config,
                               cmGeneratorTarget const* headTarget,
                               bool usage_requirements_only,
                               std::vector<cmLinkItem>& items,
                               bool& hadHeadSensitiveCondition) const
{
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(), prop, 0, 0);
  // The $<LINK_ONLY> expression may be in a link interface to specify private
  // link dependencies that are otherwise excluded from usage requirements.
  if(usage_requirements_only)
    {
    dagChecker.SetTransitivePropertiesOnly();
    }
  std::vector<std::string> libs;
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
  cmSystemTools::ExpandListArgument(cge->Evaluate(
                                      this->LocalGenerator,
                                      config,
                                      false,
                                      headTarget,
                                      this, &dagChecker), libs);
  this->LookupLinkItems(libs, items);
  hadHeadSensitiveCondition = cge->GetHadHeadSensitiveCondition();
}